

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

string_view __thiscall slang::parsing::Trivia::getRawText(Trivia *this)

{
  string_view sVar1;
  
  if ((byte)(this->kind - SkippedTokens) < 3) {
    return (string_view)(ZEXT816(0x3d6541) << 0x40);
  }
  if (this->hasFullLocation == true) {
    return ((this->field_0).fullLocation)->text;
  }
  sVar1._M_len = (ulong)(this->field_0).rawText.len;
  sVar1._M_str = (char *)(this->field_0).fullLocation;
  return sVar1;
}

Assistant:

string_view Trivia::getRawText() const {
    switch (kind) {
        case TriviaKind::Directive:
        case TriviaKind::SkippedSyntax:
        case TriviaKind::SkippedTokens:
            return "";
        default:
            if (hasFullLocation)
                return fullLocation->text;
            return {rawText.ptr, rawText.len};
    }
}